

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O3

int __thiscall
HullLibrary::calchullgen(HullLibrary *this,cbtVector3 *verts,int verts_count,int vlimit)

{
  size_t size;
  int *piVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  int iVar11;
  HullLibrary *pHVar12;
  HullLibrary *pHVar13;
  cbtHullTriangle *pcVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  int b;
  cbtVector3 *v1;
  uint uVar20;
  cbtVector3 *pcVar21;
  undefined1 auVar22 [64];
  undefined1 auVar25 [56];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  cbtScalar cVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar30 [56];
  undefined1 auVar29 [64];
  undefined1 auVar31 [16];
  cbtVector3 cVar32;
  cbtInt4 cVar33;
  cbtAlignedObjectArray<int> allow;
  cbtAlignedObjectArray<int> isextreme;
  cbtVector3 n;
  cbtAlignedObjectArray<int> local_f0;
  cbtAlignedObjectArray<int> local_d0;
  long local_b0;
  undefined8 local_a8;
  long local_a0;
  cbtVector3 local_98;
  undefined1 local_88 [16];
  ulong local_78;
  long local_70;
  long local_68;
  ulong local_60;
  float local_54;
  float local_50;
  float local_4c;
  undefined1 local_48 [16];
  
  if (verts_count < 4) {
    return 0;
  }
  cVar26 = verts->m_floats[2];
  size = (ulong)(uint)verts_count * 4;
  local_d0.m_ownsMemory = true;
  local_d0.m_data = (int *)0x0;
  local_d0.m_size = 0;
  local_d0.m_capacity = 0;
  local_88._8_8_ = 0;
  local_88._0_8_ = *(ulong *)verts->m_floats;
  pHVar12 = (HullLibrary *)cbtAlignedAllocInternal(size,0x10);
  if ((long)local_d0.m_size < 1) {
    if (local_d0.m_data != (int *)0x0) goto LAB_008eba2f;
  }
  else {
    lVar16 = 0;
    do {
      *(int *)(pHVar12 + lVar16 * 4) = local_d0.m_data[lVar16];
      lVar16 = lVar16 + 1;
    } while (local_d0.m_size != lVar16);
LAB_008eba2f:
    if (local_d0.m_ownsMemory == true) {
      cbtAlignedFreeInternal(local_d0.m_data);
    }
  }
  local_d0.m_ownsMemory = true;
  local_f0.m_ownsMemory = true;
  local_f0.m_data = (int *)0x0;
  local_f0.m_size = 0;
  local_f0.m_capacity = 0;
  local_d0.m_data = (int *)pHVar12;
  local_d0.m_capacity = verts_count;
  pHVar13 = (HullLibrary *)cbtAlignedAllocInternal(size,0x10);
  pHVar12 = (HullLibrary *)local_f0.m_data;
  if ((long)local_f0.m_size < 1) {
    if ((HullLibrary *)local_f0.m_data == (HullLibrary *)0x0) goto LAB_008ebaa1;
  }
  else {
    lVar16 = 0;
    do {
      *(undefined4 *)(pHVar13 + lVar16 * 4) = *(undefined4 *)((long)local_f0.m_data + lVar16 * 4);
      lVar16 = lVar16 + 1;
    } while (local_f0.m_size != lVar16);
  }
  if (local_f0.m_ownsMemory == true) {
    cbtAlignedFreeInternal(local_f0.m_data);
    pHVar12 = (HullLibrary *)local_f0.m_data;
  }
LAB_008ebaa1:
  local_78 = (ulong)(vlimit - 4);
  local_f0.m_ownsMemory = true;
  local_b0 = CONCAT44(local_b0._4_4_,cVar26);
  local_48 = local_88;
  uVar19 = 0;
  local_f0.m_data = (int *)pHVar13;
  local_60 = (ulong)(uint)vlimit;
  local_f0.m_capacity = verts_count;
  do {
    if (local_f0.m_size == local_f0.m_capacity) {
      uVar20 = local_f0.m_size * 2;
      if (local_f0.m_size == 0) {
        uVar20 = 1;
      }
      if (local_f0.m_size < (int)uVar20) {
        if (uVar20 == 0) {
          pHVar13 = (HullLibrary *)0x0;
        }
        else {
          pHVar13 = (HullLibrary *)cbtAlignedAllocInternal((long)(int)uVar20 << 2,0x10);
        }
        if (local_f0.m_size < 1) {
          if ((HullLibrary *)local_f0.m_data != (HullLibrary *)0x0) goto LAB_008ebb4a;
        }
        else {
          uVar17 = 0;
          do {
            *(undefined4 *)(pHVar13 + uVar17 * 4) =
                 *(undefined4 *)((long)local_f0.m_data + uVar17 * 4);
            uVar17 = uVar17 + 1;
          } while ((uint)local_f0.m_size != uVar17);
LAB_008ebb4a:
          if (local_f0.m_ownsMemory == true) {
            cbtAlignedFreeInternal(local_f0.m_data);
          }
        }
        local_f0.m_ownsMemory = true;
        pHVar12 = (HullLibrary *)local_f0.m_data;
        local_f0.m_data = (int *)pHVar13;
        local_f0.m_capacity = uVar20;
      }
    }
    *(undefined4 *)((long)local_f0.m_data + (long)local_f0.m_size * 4) = 1;
    local_f0.m_size = local_f0.m_size + 1;
    if (local_d0.m_size == local_d0.m_capacity) {
      uVar20 = local_d0.m_size * 2;
      if (local_d0.m_size == 0) {
        uVar20 = 1;
      }
      if (local_d0.m_size < (int)uVar20) {
        if (uVar20 == 0) {
          pHVar13 = (HullLibrary *)0x0;
        }
        else {
          pHVar13 = (HullLibrary *)cbtAlignedAllocInternal((long)(int)uVar20 << 2,0x10);
        }
        if (local_d0.m_size < 1) {
          if ((HullLibrary *)local_d0.m_data != (HullLibrary *)0x0) goto LAB_008ebbd9;
        }
        else {
          uVar17 = 0;
          do {
            *(undefined4 *)(pHVar13 + uVar17 * 4) =
                 *(undefined4 *)((long)local_d0.m_data + uVar17 * 4);
            uVar17 = uVar17 + 1;
          } while ((uint)local_d0.m_size != uVar17);
LAB_008ebbd9:
          if (local_d0.m_ownsMemory == true) {
            cbtAlignedFreeInternal(local_d0.m_data);
          }
        }
        local_d0.m_ownsMemory = true;
        pHVar12 = (HullLibrary *)local_d0.m_data;
        local_d0.m_data = (int *)pHVar13;
        local_d0.m_capacity = uVar20;
      }
    }
    *(undefined4 *)((long)local_d0.m_data + (long)local_d0.m_size * 4) = 0;
    local_d0.m_size = local_d0.m_size + 1;
    uVar17 = uVar19 + 1;
    auVar27 = vminss_avx(ZEXT416((uint)verts[uVar19].m_floats[2]),ZEXT416((uint)cVar26));
    cVar26 = auVar27._0_4_;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = *(ulong *)verts[uVar19].m_floats;
    local_48 = vminps_avx(auVar27,local_48);
    local_88 = vmaxps_avx(auVar27,local_88);
    auVar27 = vmaxss_avx(ZEXT416((uint)verts[uVar19].m_floats[2]),ZEXT416((uint)(float)local_b0));
    local_b0 = CONCAT44(local_b0._4_4_,auVar27._0_4_);
    uVar19 = uVar17;
  } while (uVar17 != (uint)verts_count);
  cVar33 = FindSimplex(pHVar12,verts,verts_count,&local_f0);
  iVar11 = cVar33.x;
  if (iVar11 == -1) {
    local_a8 = (ulong)local_a8._4_4_ << 0x20;
  }
  else {
    local_a0 = (long)iVar11;
    local_a8 = cVar33._0_8_ >> 0x20;
    iVar10 = cVar33.z;
    local_70 = (long)iVar10;
    local_68 = cVar33._8_8_ >> 0x20;
    local_50 = verts[local_a0].m_floats[1] + verts[local_a8].m_floats[1] +
               verts[local_70].m_floats[1] + verts[local_68].m_floats[1];
    local_4c = verts[local_a0].m_floats[0] + verts[local_a8].m_floats[0] +
               verts[local_70].m_floats[0] + verts[local_68].m_floats[0];
    auVar22 = ZEXT464((uint)local_4c);
    local_54 = verts[local_a0].m_floats[2] + verts[local_a8].m_floats[2] +
               verts[local_70].m_floats[2] + verts[local_68].m_floats[2];
    auVar28 = ZEXT464((uint)local_54);
    b = cVar33.w;
    iVar18 = cVar33.y;
    pcVar14 = allocateTriangle(this,iVar10,b,iVar18);
    (pcVar14->n).x = 2;
    (pcVar14->n).y = 3;
    (pcVar14->n).z = 1;
    pcVar14 = allocateTriangle(this,b,iVar10,iVar11);
    (pcVar14->n).x = 3;
    (pcVar14->n).y = 2;
    (pcVar14->n).z = 0;
    pcVar14 = allocateTriangle(this,iVar11,iVar18,b);
    (pcVar14->n).x = 0;
    (pcVar14->n).y = 1;
    (pcVar14->n).z = 3;
    pcVar14 = allocateTriangle(this,iVar18,iVar11,iVar10);
    lVar16 = local_a8;
    (pcVar14->n).x = 1;
    (pcVar14->n).y = 0;
    (pcVar14->n).z = 2;
    *(undefined4 *)((long)local_d0.m_data + local_68 * 4) = 1;
    *(undefined4 *)((long)local_d0.m_data + local_70 * 4) = 1;
    local_a8 = CONCAT44(local_a8._4_4_,1);
    *(undefined4 *)((long)local_d0.m_data + lVar16 * 4) = 1;
    *(undefined4 *)((long)local_d0.m_data + local_a0 * 4) = 1;
    if (0 < *(int *)(this + 4)) {
      lVar16 = 0;
      do {
        auVar30 = auVar28._8_56_;
        auVar25 = auVar22._8_56_;
        piVar1 = *(int **)(*(long *)(this + 0x10) + lVar16 * 8);
        cVar32 = TriNormal(verts + *piVar1,verts + piVar1[1],verts + piVar1[2]);
        auVar28._0_8_ = cVar32.m_floats._8_8_;
        auVar28._8_56_ = auVar30;
        auVar22._0_8_ = cVar32.m_floats._0_8_;
        auVar22._8_56_ = auVar25;
        local_98.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar22._0_16_,auVar28._0_16_);
        iVar10 = maxdirsterid<cbtVector3>(verts,verts_count,&local_98,&local_f0);
        piVar1[7] = iVar10;
        lVar16 = lVar16 + 1;
        iVar11 = *piVar1;
        fVar3 = verts[iVar10].m_floats[0] - verts[iVar11].m_floats[0];
        auVar22 = ZEXT464((uint)fVar3);
        auVar27 = vfmadd231ss_fma(ZEXT416((uint)((verts[iVar10].m_floats[1] -
                                                 verts[iVar11].m_floats[1]) * local_98.m_floats[1]))
                                  ,ZEXT416((uint)fVar3),ZEXT416((uint)local_98.m_floats[0]));
        auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)(verts[iVar10].m_floats[2] -
                                                        verts[iVar11].m_floats[2])),
                                  ZEXT416((uint)local_98.m_floats[2]));
        auVar28 = ZEXT1664(auVar27);
        piVar1[8] = auVar27._0_4_;
      } while (lVar16 < *(int *)(this + 4));
    }
    uVar19 = local_78 & 0xffffffff;
    if ((float)local_60 == 0.0) {
      uVar19 = 0x3b9ac9fc;
    }
    if (0 < (int)uVar19) {
      auVar2 = vsubps_avx(local_88,local_48);
      auVar31._0_4_ = auVar2._0_4_ * auVar2._0_4_;
      auVar31._4_4_ = auVar2._4_4_ * auVar2._4_4_;
      auVar31._8_4_ = auVar2._8_4_ * auVar2._8_4_;
      auVar31._12_4_ = auVar2._12_4_ * auVar2._12_4_;
      auVar27 = vmovshdup_avx(auVar31);
      auVar27 = vfmadd231ss_fma(auVar27,auVar2,auVar2);
      auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)((float)local_b0 - cVar26)),
                                ZEXT416((uint)((float)local_b0 - cVar26)));
      auVar27 = vsqrtss_avx(auVar27,auVar27);
      fVar3 = auVar27._0_4_ * 0.001;
      auVar29 = ZEXT464((uint)fVar3);
      local_68 = CONCAT44(local_68._4_4_,local_54 * 0.25);
      local_48._0_4_ = local_4c * 0.25;
      local_60 = CONCAT44(local_60._4_4_,local_50 * 0.25);
      local_88._0_4_ = fVar3 * 0.01;
      local_70 = CONCAT44(local_70._4_4_,fVar3 * fVar3 * 0.1);
      do {
        uVar17 = 0;
        lVar16 = 0;
        do {
          lVar15 = *(long *)(*(long *)(this + 0x10) + uVar17 * 8);
          if ((lVar16 == 0) ||
             ((lVar15 != 0 && (*(float *)(lVar16 + 0x20) < *(float *)(lVar15 + 0x20))))) {
            lVar16 = lVar15;
          }
          uVar17 = uVar17 + 1;
        } while (*(uint *)(this + 4) != uVar17);
        auVar23 = ZEXT464((uint)*(float *)(lVar16 + 0x20));
        if ((*(float *)(lVar16 + 0x20) <= fVar3) || (lVar16 == 0)) break;
        iVar11 = *(int *)(lVar16 + 0x1c);
        *(undefined4 *)((long)local_d0.m_data + (long)iVar11 * 4) = 1;
        lVar16 = (long)*(int *)(this + 4);
        local_78 = uVar19;
        if (lVar16 != 0) {
          pcVar21 = verts + iVar11;
          do {
            auVar30 = auVar29._8_56_;
            auVar25 = auVar23._8_56_;
            pcVar14 = *(cbtHullTriangle **)(*(long *)(this + 0x10) + -8 + lVar16 * 8);
            if (pcVar14 != (cbtHullTriangle *)0x0) {
              iVar10 = (pcVar14->super_cbtInt3).x;
              cVar32 = TriNormal(verts + iVar10,verts + (pcVar14->super_cbtInt3).y,
                                 verts + (pcVar14->super_cbtInt3).z);
              auVar29._0_8_ = cVar32.m_floats._8_8_;
              auVar29._8_56_ = auVar30;
              auVar23._0_8_ = cVar32.m_floats._0_8_;
              auVar23._8_56_ = auVar25;
              auVar27 = vmovshdup_avx(auVar23._0_16_);
              auVar27 = vfmadd231ss_fma(ZEXT416((uint)(auVar27._0_4_ *
                                                      (pcVar21->m_floats[1] -
                                                      verts[iVar10].m_floats[1]))),auVar23._0_16_,
                                        ZEXT416((uint)(pcVar21->m_floats[0] -
                                                      verts[iVar10].m_floats[0])));
              auVar27 = vfmadd231ss_fma(auVar27,auVar29._0_16_,
                                        ZEXT416((uint)(pcVar21->m_floats[2] -
                                                      verts[iVar10].m_floats[2])));
              if ((float)local_88._0_4_ < auVar27._0_4_) {
                extrude(this,pcVar14,iVar11);
              }
            }
            lVar16 = lVar16 + -1;
          } while (lVar16 != 0);
          iVar10 = *(int *)(this + 4);
          if (iVar10 != 0) {
            local_a0 = CONCAT44(local_a0._4_4_,iVar10);
            do {
              auVar30 = auVar29._8_56_;
              auVar25 = auVar23._8_56_;
              lVar16 = (long)iVar10;
              iVar10 = iVar10 + -1;
              piVar1 = *(int **)(*(long *)(this + 0x10) + -8 + lVar16 * 8);
              if (piVar1 != (int *)0x0) {
                iVar18 = *piVar1;
                if (((iVar18 != iVar11) && (piVar1[1] != iVar11)) && (piVar1[2] != iVar11)) break;
                v1 = verts + piVar1[1];
                pcVar21 = verts + piVar1[2];
                local_b0 = *(long *)(this + 0x10);
                cVar32 = TriNormal(verts + iVar18,v1,pcVar21);
                auVar29._0_8_ = cVar32.m_floats._8_8_;
                auVar29._8_56_ = auVar30;
                auVar23._0_8_ = cVar32.m_floats._0_8_;
                auVar23._8_56_ = auVar25;
                auVar27 = vmovshdup_avx(auVar23._0_16_);
                auVar27 = vfmadd231ss_fma(ZEXT416((uint)(auVar27._0_4_ *
                                                        ((float)local_60 - verts[iVar18].m_floats[1]
                                                        ))),auVar23._0_16_,
                                          ZEXT416((uint)((float)local_48._0_4_ -
                                                        verts[iVar18].m_floats[0])));
                auVar27 = vfmadd231ss_fma(auVar27,auVar29._0_16_,
                                          ZEXT416((uint)((float)local_68 - verts[iVar18].m_floats[2]
                                                        )));
                if (auVar27._0_4_ <= (float)local_88._0_4_) {
                  fVar4 = v1->m_floats[1] - verts[iVar18].m_floats[1];
                  fVar5 = v1->m_floats[2] - verts[iVar18].m_floats[2];
                  fVar6 = pcVar21->m_floats[1] - v1->m_floats[1];
                  fVar7 = v1->m_floats[0] - verts[iVar18].m_floats[0];
                  fVar8 = pcVar21->m_floats[2] - v1->m_floats[2];
                  fVar9 = pcVar21->m_floats[0] - v1->m_floats[0];
                  auVar27 = vfmsub231ss_fma(ZEXT416((uint)(fVar6 * fVar5)),ZEXT416((uint)fVar4),
                                            ZEXT416((uint)fVar8));
                  auVar2 = vfmsub231ss_fma(ZEXT416((uint)(fVar8 * fVar7)),ZEXT416((uint)fVar9),
                                           ZEXT416((uint)fVar5));
                  auVar31 = vfmsub231ss_fma(ZEXT416((uint)(fVar9 * fVar4)),ZEXT416((uint)fVar7),
                                            ZEXT416((uint)fVar6));
                  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(auVar2._0_4_ * auVar2._0_4_)),auVar27,
                                            auVar27);
                  auVar27 = vfmadd231ss_fma(auVar27,auVar31,auVar31);
                  auVar27 = vsqrtss_avx(auVar27,auVar27);
                  auVar23 = ZEXT1664(auVar27);
                  auVar29 = ZEXT464((uint)(float)local_70);
                  if ((float)local_70 <= auVar27._0_4_) goto LAB_008ec240;
                }
                extrude(this,*(cbtHullTriangle **)(local_b0 + (long)piVar1[3] * 8),iVar11);
                iVar10 = *(int *)(this + 4);
                local_a0 = CONCAT44(local_a0._4_4_,iVar10);
              }
LAB_008ec240:
            } while (iVar10 != 0);
            if ((int)local_a0 != 0) {
              lVar16 = (long)(int)local_a0;
              do {
                auVar30 = auVar29._8_56_;
                auVar25 = auVar23._8_56_;
                piVar1 = *(int **)(*(long *)(this + 0x10) + -8 + lVar16 * 8);
                if (piVar1 != (int *)0x0) {
                  if (-1 < piVar1[7]) break;
                  cVar32 = TriNormal(verts + *piVar1,verts + piVar1[1],verts + piVar1[2]);
                  auVar29._0_8_ = cVar32.m_floats._8_8_;
                  auVar29._8_56_ = auVar30;
                  auVar24._0_8_ = cVar32.m_floats._0_8_;
                  auVar24._8_56_ = auVar25;
                  local_98.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar24._0_16_,auVar29._0_16_);
                  auVar23 = ZEXT1664((undefined1  [16])local_98.m_floats);
                  iVar11 = maxdirsterid<cbtVector3>(verts,verts_count,&local_98,&local_f0);
                  piVar1[7] = iVar11;
                  lVar15 = (long)iVar11;
                  if (*(int *)((long)local_d0.m_data + lVar15 * 4) == 0) {
                    iVar11 = *piVar1;
                    fVar4 = verts[lVar15].m_floats[0] - verts[iVar11].m_floats[0];
                    auVar23 = ZEXT464((uint)fVar4);
                    auVar27 = vfmadd231ss_fma(ZEXT416((uint)((verts[lVar15].m_floats[1] -
                                                             verts[iVar11].m_floats[1]) *
                                                            local_98.m_floats[1])),
                                              ZEXT416((uint)fVar4),
                                              ZEXT416((uint)local_98.m_floats[0]));
                    auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)(verts[lVar15].m_floats[2] -
                                                                    verts[iVar11].m_floats[2])),
                                              ZEXT416((uint)local_98.m_floats[2]));
                    auVar29 = ZEXT1664(auVar27);
                    piVar1[8] = auVar27._0_4_;
                  }
                  else {
                    piVar1[7] = -1;
                  }
                }
                lVar16 = lVar16 + -1;
              } while (lVar16 != 0);
            }
          }
        }
        uVar19 = (ulong)((int)local_78 - 1);
      } while (1 < (int)local_78);
    }
  }
  cbtAlignedObjectArray<int>::~cbtAlignedObjectArray(&local_f0);
  cbtAlignedObjectArray<int>::~cbtAlignedObjectArray(&local_d0);
  return (int)local_a8;
}

Assistant:

int HullLibrary::calchullgen(cbtVector3 *verts, int verts_count, int vlimit)
{
	if (verts_count < 4) return 0;
	if (vlimit == 0) vlimit = 1000000000;
	int j;
	cbtVector3 bmin(*verts), bmax(*verts);
	cbtAlignedObjectArray<int> isextreme;
	isextreme.reserve(verts_count);
	cbtAlignedObjectArray<int> allow;
	allow.reserve(verts_count);

	for (j = 0; j < verts_count; j++)
	{
		allow.push_back(1);
		isextreme.push_back(0);
		bmin.setMin(verts[j]);
		bmax.setMax(verts[j]);
	}
	cbtScalar epsilon = (bmax - bmin).length() * cbtScalar(0.001);
	cbtAssert(epsilon != 0.0);

	cbtInt4 p = FindSimplex(verts, verts_count, allow);
	if (p.x == -1) return 0;  // simplex failed

	cbtVector3 center = (verts[p[0]] + verts[p[1]] + verts[p[2]] + verts[p[3]]) / cbtScalar(4.0);  // a valid interior point
	cbtHullTriangle *t0 = allocateTriangle(p[2], p[3], p[1]);
    t0->n = cbtInt3(2, 3, 1);
	cbtHullTriangle *t1 = allocateTriangle(p[3], p[2], p[0]);
    t1->n = cbtInt3(3, 2, 0);
	cbtHullTriangle *t2 = allocateTriangle(p[0], p[1], p[3]);
    t2->n = cbtInt3(0, 1, 3);
	cbtHullTriangle *t3 = allocateTriangle(p[1], p[0], p[2]);
    t3->n = cbtInt3(1, 0, 2);
	isextreme[p[0]] = isextreme[p[1]] = isextreme[p[2]] = isextreme[p[3]] = 1;
	checkit(t0);
	checkit(t1);
	checkit(t2);
	checkit(t3);

	for (j = 0; j < m_tris.size(); j++)
	{
		cbtHullTriangle *t = m_tris[j];
		cbtAssert(t);
		cbtAssert(t->vmax < 0);
		cbtVector3 n = TriNormal(verts[(*t)[0]], verts[(*t)[1]], verts[(*t)[2]]);
		t->vmax = maxdirsterid(verts, verts_count, n, allow);
		t->rise = cbtDot(n, verts[t->vmax] - verts[(*t)[0]]);
	}
	cbtHullTriangle *te;
	vlimit -= 4;
	while (vlimit > 0 && ((te = extrudable(epsilon)) != 0))
	{
		//int3 ti=*te;
		int v = te->vmax;
		cbtAssert(v != -1);
		cbtAssert(!isextreme[v]);  // wtf we've already done this vertex
		isextreme[v] = 1;
		//if(v==p0 || v==p1 || v==p2 || v==p3) continue; // done these already
		j = m_tris.size();
		while (j--)
		{
			if (!m_tris[j]) continue;
            cbtInt3 t = *m_tris[j];
			if (above(verts, t, verts[v], cbtScalar(0.01) * epsilon))
			{
				extrude(m_tris[j], v);
			}
		}
		// now check for those degenerate cases where we have a flipped triangle or a really skinny triangle
		j = m_tris.size();
		while (j--)
		{
			if (!m_tris[j]) continue;
			if (!hasvert(*m_tris[j], v)) break;
            cbtInt3 nt = *m_tris[j];
			if (above(verts, nt, center, cbtScalar(0.01) * epsilon) || cbtCross(verts[nt[1]] - verts[nt[0]], verts[nt[2]] - verts[nt[1]]).length() < epsilon * epsilon * cbtScalar(0.1))
			{
				cbtHullTriangle *nb = m_tris[m_tris[j]->n[0]];
				cbtAssert(nb);
				cbtAssert(!hasvert(*nb, v));
				cbtAssert(nb->id < j);
				extrude(nb, v);
				j = m_tris.size();
			}
		}
		j = m_tris.size();
		while (j--)
		{
			cbtHullTriangle *t = m_tris[j];
			if (!t) continue;
			if (t->vmax >= 0) break;
			cbtVector3 n = TriNormal(verts[(*t)[0]], verts[(*t)[1]], verts[(*t)[2]]);
			t->vmax = maxdirsterid(verts, verts_count, n, allow);
			if (isextreme[t->vmax])
			{
				t->vmax = -1;  // already done that vertex - algorithm needs to be able to terminate.
			}
			else
			{
				t->rise = cbtDot(n, verts[t->vmax] - verts[(*t)[0]]);
			}
		}
		vlimit--;
	}
	return 1;
}